

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrMan.c
# Opt level: O0

void Rwr_ManPrintStatsFile(Rwr_Man_t *p)

{
  FILE *__stream;
  FILE *pTable;
  Rwr_Man_t *p_local;
  
  __stream = fopen("stats.txt","a+");
  fprintf(__stream,"%d ",(ulong)(uint)p->nCutsGood);
  fprintf(__stream,"%d ",(ulong)(uint)p->nSubgraphs);
  fprintf(__stream,"%d ",(ulong)(uint)p->nNodesRewritten);
  fprintf(__stream,"%d",(ulong)(uint)p->nNodesGained);
  fprintf(__stream,"\n");
  fclose(__stream);
  return;
}

Assistant:

void Rwr_ManPrintStatsFile( Rwr_Man_t * p )
{
    FILE * pTable;
    pTable = fopen( "stats.txt", "a+" );
    fprintf( pTable, "%d ", p->nCutsGood );
    fprintf( pTable, "%d ", p->nSubgraphs );
    fprintf( pTable, "%d ", p->nNodesRewritten );
    fprintf( pTable, "%d", p->nNodesGained );
    fprintf( pTable, "\n" );
    fclose( pTable );
}